

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

Expression *
slang::ast::DistExpression::fromSyntax
          (Compilation *comp,ExpressionOrDistSyntax *syntax,ASTContext *context)

{
  SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *pSVar1;
  LanguageVersion LVar2;
  DistConstraintListSyntax *pDVar3;
  size_t sVar4;
  Expression *args_1;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  bool bVar5;
  bool bVar6;
  int iVar7;
  DistItemBaseSyntax *pDVar8;
  Diagnostic *pDVar9;
  SyntaxNode *this;
  ulong uVar10;
  undefined4 extraout_var;
  DistExpression *expr;
  ParentList *pPVar11;
  Expression *extraout_RDX;
  Expression *extraout_RDX_00;
  Expression *extraout_RDX_01;
  Expression *extraout_RDX_02;
  Expression *extraout_RDX_03;
  Expression *src;
  Expression *pEVar12;
  DistExpression *args;
  long lVar13;
  DistWeight DVar14;
  SourceRange sourceRange;
  string_view arg;
  undefined7 uStack_1d8;
  bool bad;
  ASTContext *local_1d0;
  Compilation *local_1c8;
  ExpressionOrDistSyntax *local_1c0;
  DistItem local_1b8;
  iterator __begin2_1;
  _Storage<slang::ast::DistExpression::DistWeight,_true> local_180;
  undefined1 local_170;
  anon_class_16_2_80a99c9f createWeight;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  SmallVector<slang::ast::DistExpression::DistItem,_4UL> items;
  
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.data_ =
       (pointer)expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.
                firstElement;
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.len = 0;
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.cap = 5;
  pDVar3 = (syntax->distribution).ptr;
  pSVar1 = &pDVar3->items;
  items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.len = 0;
  sVar4 = (pDVar3->items).elements._M_extent._M_extent_value;
  local_1d0 = context;
  local_1c8 = comp;
  local_1c0 = syntax;
  items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.data_ = (pointer)pSVar1;
  for (; ((SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *)
          items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.data_ != pSVar1 ||
         (items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.len != sVar4 + 1 >> 1));
      items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.len =
           items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.len + 1) {
    pDVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::
             iterator_base<slang::syntax::DistItemBaseSyntax_*>::dereference
                       ((iterator_base<slang::syntax::DistItemBaseSyntax_*> *)&items);
    if ((pDVar8->super_SyntaxNode).kind == DistItem) {
      bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
           *(pointer *)&pDVar8[1].super_SyntaxNode;
      SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
      emplace_back<slang::syntax::ExpressionSyntax_const*>
                ((SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *)&expressions,
                 (ExpressionSyntax **)&bound);
    }
  }
  LVar2 = (local_1c8->options).languageVersion;
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)bound.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  expressions_00._M_extent._M_extent_value = (size_t)&bound;
  expressions_00._M_ptr =
       (pointer)expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.len;
  bVar5 = Expression::bindMembershipExpressions
                    ((Expression *)local_1d0,(ASTContext *)0x8a,(ushort)((int)LVar2 < 1),false,false
                     ,true,SUB81((local_1c0->expr).ptr,0),
                     (ExpressionSyntax *)
                     expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.
                     data_,expressions_00,
                     (SmallVectorBase<const_slang::ast::Expression_*> *)CONCAT17(bad,uStack_1d8));
  bad = !bVar5;
  args_1 = *bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_;
  src = (Expression *)bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_;
  if (!bad && 0 < (int)LVar2) {
    bVar5 = Type::isNumeric((args_1->type).ptr);
    src = extraout_RDX;
    if (!bVar5) {
      pDVar9 = ASTContext::addDiag(local_1d0,(DiagCode)0x270007,args_1->sourceRange);
      pDVar9 = ast::operator<<(pDVar9,(args_1->type).ptr);
      arg._M_str = "dist";
      arg._M_len = 4;
      Diagnostic::operator<<(pDVar9,arg);
      bad = true;
      src = extraout_RDX_00;
    }
  }
  createWeight.context = local_1d0;
  createWeight.bad = &bad;
  local_170 = 0;
  items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.data_ =
       (pointer)items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.firstElement;
  items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.len = 0;
  items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>.cap = 4;
  pDVar3 = (local_1c0->distribution).ptr;
  pSVar1 = &pDVar3->items;
  __begin2_1.index = 0;
  __begin2_1.list = pSVar1;
  sVar4 = (pDVar3->items).elements._M_extent._M_extent_value;
  lVar13 = 1;
  bVar5 = false;
  uVar10 = 0;
  pPVar11 = pSVar1;
  pEVar12 = args_1;
  while ((pPVar11 != pSVar1 || (uVar10 != sVar4 + 1 >> 1))) {
    this = &slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::
            iterator_base<slang::syntax::DistItemBaseSyntax_*>::dereference(&__begin2_1)->
            super_SyntaxNode;
    if (this->kind == DistItem) {
      local_1b8.value = bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_[lVar13];
      local_1b8.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
           false;
      if ((DistWeightSyntax *)this[1].parent != (DistWeightSyntax *)0x0) {
        DVar14 = fromSyntax::anon_class_16_2_80a99c9f::operator()
                           (&createWeight,(DistWeightSyntax *)this[1].parent);
        local_1b8.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
        _M_value.expr = DVar14.expr;
        local_1b8.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
        _M_value.kind = DVar14.kind;
        if (local_1b8.weight.
            super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged == false
           ) {
          local_1b8.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
          _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged
               = true;
        }
      }
      if ((local_1b8.value)->kind == ValueRange) {
        bVar6 = Type::isFloating((Type *)((local_1b8.value[1].type.ptr)->super_Symbol).name._M_len);
        if ((bVar6) &&
           ((local_1b8.weight.
             super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged != true
            || (local_1b8.weight.
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
                _M_value.kind != PerRange)))) {
          pDVar9 = ASTContext::addDiag(local_1d0,(DiagCode)0x490007,(local_1b8.value)->sourceRange);
          if ((local_1b8.weight.
               super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged ==
               true) &&
             (local_1b8.weight.
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
              _M_value.expr != (Expression *)0x0)) {
            Diagnostic::operator<<
                      (pDVar9,(local_1b8.weight.
                               super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                               _M_payload._M_value.expr)->sourceRange);
          }
        }
      }
      SmallVectorBase<slang::ast::DistExpression::DistItem>::
      emplace_back<slang::ast::DistExpression::DistItem&>
                (&items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>,&local_1b8);
      lVar13 = lVar13 + 1;
      src = extraout_RDX_02;
    }
    else {
      src = extraout_RDX_01;
      if ((DistWeightSyntax *)this[1].previewNode != (DistWeightSyntax *)0x0) {
        if (bVar5) {
          sourceRange = slang::syntax::SyntaxNode::sourceRange(this);
          pDVar9 = ASTContext::addDiag(local_1d0,(DiagCode)0x750007,sourceRange);
          Diagnostic::addNote(pDVar9,(DiagCode)0xc0001,pEVar12->sourceRange);
          src = extraout_RDX_03;
        }
        else {
          DVar14 = fromSyntax::anon_class_16_2_80a99c9f::operator()
                             (&createWeight,(DistWeightSyntax *)this[1].previewNode);
          src = DVar14.expr;
          local_180._M_value.kind = DVar14.kind;
          pEVar12 = src;
          local_180._M_value.expr = src;
          if (!bVar5) {
            local_170 = 1;
            bVar5 = true;
          }
        }
      }
    }
    uVar10 = __begin2_1.index + 1;
    __begin2_1.index = uVar10;
    pPVar11 = __begin2_1.list;
  }
  args = (DistExpression *)local_1c8->voidType;
  iVar7 = SmallVectorBase<slang::ast::DistExpression::DistItem>::copy
                    (&items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>,
                     (EVP_PKEY_CTX *)local_1c8,(EVP_PKEY_CTX *)src);
  local_1b8.value = (Expression *)CONCAT44(extraout_var,iVar7);
  __begin2_1 = (iterator)slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_1c0);
  expr = BumpAllocator::
         emplace<slang::ast::DistExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::DistExpression::DistItem,18446744073709551615ul>,std::optional<slang::ast::DistExpression::DistWeight>&,slang::SourceRange>
                   (&local_1c8->super_BumpAllocator,(Type *)args,args_1,
                    (span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *)&local_1b8
                    ,(optional<slang::ast::DistExpression::DistWeight> *)&local_180._M_value,
                    (SourceRange *)&__begin2_1);
  if (bad == true) {
    args = expr;
    expr = (DistExpression *)Expression::badExpr(local_1c8,&expr->super_Expression);
  }
  SmallVectorBase<slang::ast::DistExpression::DistItem>::cleanup
            (&items.super_SmallVectorBase<slang::ast::DistExpression::DistItem>,(EVP_PKEY_CTX *)args
            );
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup
            (&bound.super_SmallVectorBase<const_slang::ast::Expression_*>,(EVP_PKEY_CTX *)args);
  SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::cleanup
            (&expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>,
             (EVP_PKEY_CTX *)args);
  return &expr->super_Expression;
}

Assistant:

Expression& DistExpression::fromSyntax(Compilation& comp, const ExpressionOrDistSyntax& syntax,
                                       const ASTContext& context) {
    SmallVector<const ExpressionSyntax*> expressions;
    for (auto item : syntax.distribution->items) {
        if (item->kind == SyntaxKind::DistItem)
            expressions.push_back(item->as<DistItemSyntax>().range);
    }

    const bool allowReal = comp.languageVersion() >= LanguageVersion::v1800_2023;

    SmallVector<const Expression*> bound;
    bool bad = !bindMembershipExpressions(
        context, TokenKind::DistKeyword, /* requireIntegral */ !allowReal,
        /* unwrapUnpacked */ false, /* allowTypeReferences */ false,
        /* allowValueRange */ true, *syntax.expr, expressions, bound);

    auto& pred = *bound[0];
    if (allowReal && !bad) {
        if (!pred.type->isNumeric()) {
            context.addDiag(diag::BadSetMembershipType, pred.sourceRange) << *pred.type << "dist"sv;
            bad = true;
        }
    }

    auto createWeight = [&](const DistWeightSyntax& weight) {
        auto weightKind = DistWeight::PerValue;
        if (weight.op.kind == TokenKind::ColonSlash ||
            (weight.op.kind == TokenKind::Colon && weight.extraOp.kind == TokenKind::Slash)) {
            weightKind = DistWeight::PerRange;
        }

        auto& weightExpr = Expression::bind(*weight.expr, context);
        if (!context.requireIntegral(weightExpr))
            bad = true;

        return DistWeight{weightKind, &weightExpr};
    };

    std::optional<DistWeight> defaultWeight;
    SmallVector<DistItem, 4> items;
    size_t index = 1;
    for (auto item : syntax.distribution->items) {
        if (item->kind != SyntaxKind::DistItem) {
            if (auto weight = item->as<DefaultDistItemSyntax>().weight) {
                if (defaultWeight) {
                    auto& diag = context.addDiag(diag::MultipleDefaultDistWeight,
                                                 item->sourceRange());
                    diag.addNote(diag::NotePreviousUsage, defaultWeight->expr->sourceRange);
                }
                else {
                    defaultWeight = createWeight(*weight);
                }
            }
            continue;
        }

        DistItem di{*bound[index++], {}};
        if (auto weight = item->as<DistItemSyntax>().weight)
            di.weight = createWeight(*weight);

        if (di.value.kind == ExpressionKind::ValueRange &&
            di.value.as<ValueRangeExpression>().left().type->isFloating() &&
            (!di.weight || di.weight->kind != DistWeight::PerRange)) {
            auto& diag = context.addDiag(diag::DistRealRangeWeight, di.value.sourceRange);
            if (di.weight && di.weight->expr)
                diag << di.weight->expr->sourceRange;
        }

        items.emplace_back(di);
    }

    auto result = comp.emplace<DistExpression>(comp.getVoidType(), pred, items.copy(comp),
                                               defaultWeight, syntax.sourceRange());
    if (bad)
        return badExpr(comp, result);

    return *result;
}